

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O0

void * __thiscall
tracing_layer::APITracerContextImp::getActiveTracersList(APITracerContextImp *this)

{
  bool bVar1;
  ThreadPrivateTracerData *this_00;
  long lVar2;
  APITracerContextImp *pAVar3;
  tracer_array_t *stableTracerArray;
  APITracerContextImp *this_local;
  
  this_00 = (ThreadPrivateTracerData *)myThreadPrivateTracerData();
  bVar1 = ThreadPrivateTracerData::testAndSetThreadTracerDataInitializedAndOnList(this_00);
  if (bVar1) {
    do {
      this_local = (APITracerContextImp *)
                   std::atomic<tracing_layer::tracerArray_*>::load
                             ((atomic<tracing_layer::tracerArray_*> *)
                              (pGlobalAPITracerContextImp + 0x40),memory_order_acquire);
      lVar2 = myThreadPrivateTracerData();
      std::atomic<tracing_layer::tracerArray_*>::store
                ((atomic<tracing_layer::tracerArray_*> *)(lVar2 + 8),(__pointer_type)this_local,
                 memory_order_relaxed);
      pAVar3 = (APITracerContextImp *)
               std::atomic<tracing_layer::tracerArray_*>::load
                         ((atomic<tracing_layer::tracerArray_*> *)
                          (pGlobalAPITracerContextImp + 0x40),memory_order_relaxed);
    } while (this_local != pAVar3);
  }
  else {
    this_local = (APITracerContextImp *)0x0;
  }
  return this_local;
}

Assistant:

void *APITracerContextImp::getActiveTracersList() {
    tracer_array_t *stableTracerArray = nullptr;

    if (!myThreadPrivateTracerData
             .testAndSetThreadTracerDataInitializedAndOnList()) {
        return nullptr;
    }

    do {
        stableTracerArray = pGlobalAPITracerContextImp->activeTracerArray.load(
            std::memory_order_acquire);
        myThreadPrivateTracerData.tracerArrayPointer.store(
            stableTracerArray, std::memory_order_relaxed);
    } while (stableTracerArray !=
             pGlobalAPITracerContextImp->activeTracerArray.load(
                 std::memory_order_relaxed));
    return (void *)stableTracerArray;
}